

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<int>
          (OutOfRangeException *this,string *msg,int params)

{
  string local_30;
  
  Exception::ConstructMessage<int>(&local_30,msg,params);
  OutOfRangeException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}